

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O2

void highbd_sad16x4_core_avx2(__m256i *s,__m256i *r,__m256i *sad_acc)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  __m256i alVar3;
  long lVar4;
  
  for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 0x20) {
    auVar2 = vpsubw_avx2(*(undefined1 (*) [32])((long)*s + lVar4),
                         *(undefined1 (*) [32])((long)*r + lVar4));
    auVar2 = vpabsw_avx2(auVar2);
    *(undefined1 (*) [32])((long)*s + lVar4) = auVar2;
  }
  auVar2 = vpaddw_avx2((undefined1  [32])s[1],(undefined1  [32])*s);
  auVar2 = vpaddw_avx2(auVar2,(undefined1  [32])s[2]);
  alVar1 = (__m256i)vpaddw_avx2(auVar2,(undefined1  [32])s[3]);
  *s = alVar1;
  alVar3 = (__m256i)vpunpcklwd_avx2((undefined1  [32])alVar1,
                                    SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  *r = alVar3;
  alVar1 = (__m256i)vpunpckhwd_avx2((undefined1  [32])*s,SUB6432(ZEXT1664((undefined1  [16])0x0),0))
  ;
  r[1] = alVar1;
  alVar1 = (__m256i)vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar3);
  *r = alVar1;
  alVar1 = (__m256i)vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])*sad_acc);
  *sad_acc = alVar1;
  return;
}

Assistant:

static inline void highbd_sad16x4_core_avx2(__m256i *s, __m256i *r,
                                            __m256i *sad_acc) {
  const __m256i zero = _mm256_setzero_si256();
  int i;
  for (i = 0; i < 4; i++) {
    s[i] = _mm256_sub_epi16(s[i], r[i]);
    s[i] = _mm256_abs_epi16(s[i]);
  }

  s[0] = _mm256_add_epi16(s[0], s[1]);
  s[0] = _mm256_add_epi16(s[0], s[2]);
  s[0] = _mm256_add_epi16(s[0], s[3]);

  r[0] = _mm256_unpacklo_epi16(s[0], zero);
  r[1] = _mm256_unpackhi_epi16(s[0], zero);

  r[0] = _mm256_add_epi32(r[0], r[1]);
  *sad_acc = _mm256_add_epi32(*sad_acc, r[0]);
}